

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O3

void __thiscall Imf_3_4::InputFile::Data::lockedSetFrameBuffer(Data *this,FrameBuffer *frameBuffer)

{
  _Rb_tree_header *p_Var1;
  FrameBuffer *this_00;
  _Base_ptr fv;
  _Rb_tree_color t;
  CompositeDeepScanLine *pCVar2;
  FrameBuffer *this_01;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  pointer __p;
  CompositeDeepScanLine *this_02;
  const_iterator cVar7;
  const_iterator cVar8;
  ConstIterator CVar9;
  pointer __p_00;
  void *__s;
  char *pcVar10;
  ostream *this_03;
  ArgExc *this_04;
  ulong __n;
  undefined1 in_R10B;
  int iVar11;
  sbyte sVar12;
  exr_attr_box2i_t eVar13;
  int local_200;
  stringstream _iex_throw_s;
  ostream local_1a8 [376];
  
  if (this->_storage - EXR_STORAGE_DEEP_SCANLINE < 2) {
    this_02 = (this->_compositor)._M_t.
              super___uniq_ptr_impl<Imf_3_4::CompositeDeepScanLine,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
              ._M_t.
              super__Tuple_impl<0UL,_Imf_3_4::CompositeDeepScanLine_*,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
              .super__Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>._M_head_impl;
    if (this_02 == (CompositeDeepScanLine *)0x0) {
      this_02 = (CompositeDeepScanLine *)operator_new(0x10);
      CompositeDeepScanLine::CompositeDeepScanLine(this_02);
      pCVar2 = (this->_compositor)._M_t.
               super___uniq_ptr_impl<Imf_3_4::CompositeDeepScanLine,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
               ._M_t.
               super__Tuple_impl<0UL,_Imf_3_4::CompositeDeepScanLine_*,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
               .super__Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>._M_head_impl;
      (this->_compositor)._M_t.
      super___uniq_ptr_impl<Imf_3_4::CompositeDeepScanLine,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
      ._M_t.
      super__Tuple_impl<0UL,_Imf_3_4::CompositeDeepScanLine_*,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
      .super__Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>._M_head_impl = this_02;
      if (pCVar2 != (CompositeDeepScanLine *)0x0) {
        (*pCVar2->_vptr_CompositeDeepScanLine[1])();
        this_02 = (this->_compositor)._M_t.
                  super___uniq_ptr_impl<Imf_3_4::CompositeDeepScanLine,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Imf_3_4::CompositeDeepScanLine_*,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
                  .super__Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>._M_head_impl;
      }
    }
    CompositeDeepScanLine::setFrameBuffer(this_02,frameBuffer);
    return;
  }
  if (this->_storage != EXR_STORAGE_TILED) {
    ScanLineInputFile::setFrameBuffer
              ((this->_sFile)._M_t.
               super___uniq_ptr_impl<Imf_3_4::ScanLineInputFile,_std::default_delete<Imf_3_4::ScanLineInputFile>_>
               ._M_t.
               super__Tuple_impl<0UL,_Imf_3_4::ScanLineInputFile_*,_std::default_delete<Imf_3_4::ScanLineInputFile>_>
               .super__Head_base<0UL,_Imf_3_4::ScanLineInputFile_*,_false>._M_head_impl,frameBuffer)
    ;
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
    ::operator=((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)&this->_cacheFrameBuffer,
                (_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)frameBuffer);
    return;
  }
  this_00 = &this->_cacheFrameBuffer;
  cVar7._M_node = (_Base_ptr)FrameBuffer::begin(this_00);
  cVar8._M_node = (_Base_ptr)FrameBuffer::begin(frameBuffer);
  while( true ) {
    CVar9 = FrameBuffer::end(this_00);
    if ((const_iterator)cVar7._M_node == CVar9._i._M_node) break;
    CVar9 = FrameBuffer::end(frameBuffer);
    if ((const_iterator)cVar8._M_node == CVar9._i._M_node) break;
    iVar4 = strcmp((char *)(cVar7._M_node + 1),(char *)(cVar8._M_node + 1));
    if ((iVar4 != 0) || (cVar7._M_node[9]._M_color != cVar8._M_node[9]._M_color)) break;
    cVar7._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar7._M_node);
    cVar8._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar8._M_node);
  }
  CVar9 = FrameBuffer::end(this_00);
  if ((const_iterator)cVar7._M_node == CVar9._i._M_node) {
    CVar9 = FrameBuffer::end(frameBuffer);
    if ((const_iterator)cVar8._M_node == CVar9._i._M_node) goto LAB_00186a76;
  }
  iVar11 = 0;
  std::__uniq_ptr_impl<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_>::reset
            ((__uniq_ptr_impl<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_> *)
             &this->_cachedBuffer,(pointer)0x0);
  std::
  vector<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
  ::clear(&this->_slicePointers);
  this->_cachedTileY = -1;
  __p_00 = (pointer)operator_new(0x30);
  p_Var1 = &(__p_00->_map)._M_t._M_impl.super__Rb_tree_header;
  (__p_00->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__p_00->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(__p_00->_map)._M_t._M_impl = 0;
  *(undefined8 *)&(__p_00->_map)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (__p_00->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (__p_00->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (__p_00->_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __iex_throw_s = (void *)0x0;
  std::__uniq_ptr_impl<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_>::reset
            ((__uniq_ptr_impl<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_> *)
             &this->_cachedBuffer,__p_00);
  std::unique_ptr<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_>::~unique_ptr
            ((unique_ptr<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_> *)
             &_iex_throw_s);
  iVar4 = 0;
  if (this->_part != (InputPartData *)0x0) {
    iVar4 = this->_part->partNumber;
  }
  eVar13 = Context::dataWindow(this->_ctxt,iVar4);
  this->_cachedOffset = eVar13.min.x;
  uVar5 = TiledInputFile::tileYSize
                    ((this->_tFile)._M_t.
                     super___uniq_ptr_impl<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Imf_3_4::TiledInputFile_*,_std::default_delete<Imf_3_4::TiledInputFile>_>
                     .super__Head_base<0UL,_Imf_3_4::TiledInputFile_*,_false>._M_head_impl);
  if (this->_part != (InputPartData *)0x0) {
    iVar11 = this->_part->partNumber;
  }
  bVar3 = Context::chunkTableValid(this->_ctxt,iVar11);
  if (!bVar3) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,
               "Unable to use generic API to read with (partially?) corrupt chunk table in ",0x4b);
    pcVar10 = Context::fileName(this->_ctxt);
    this_03 = std::operator<<(local_1a8,pcVar10);
    std::__ostream_insert<char,std::char_traits<char>>(this_03,", part ",7);
    iVar4 = 0;
    if (this->_part != (InputPartData *)0x0) {
      iVar4 = this->_part->partNumber;
    }
    std::ostream::operator<<((ostream *)this_03,iVar4);
    this_04 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this_04,(stringstream *)&_iex_throw_s);
    __cxa_throw(this_04,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  cVar7._M_node = (_Base_ptr)FrameBuffer::begin(frameBuffer);
  cVar8._M_node = (_Base_ptr)FrameBuffer::end(frameBuffer);
  if (cVar7._M_node != cVar8._M_node) {
    local_200 = eVar13.max.x;
    do {
      t = cVar7._M_node[9]._M_color;
      fv = cVar7._M_node[10]._M_parent;
      bVar3 = Context::hasChannel(this->_ctxt,iVar4,(char *)(cVar7._M_node + 1));
      if (bVar3) {
        iVar11 = this->_cachedOffset;
        sVar12 = (t != _S_black) + 1;
        __n = (((long)local_200 - (long)eVar13.min.x) + 1) * (ulong)uVar5 << sVar12;
        __s = operator_new__(__n);
        memset(__s,0,__n);
        __iex_throw_s = __s;
        std::
        vector<std::unique_ptr<char[],std::default_delete<char[]>>,std::allocator<std::unique_ptr<char[],std::default_delete<char[]>>>>
        ::emplace_back<std::unique_ptr<char[],std::default_delete<char[]>>>
                  ((vector<std::unique_ptr<char[],std::default_delete<char[]>>,std::allocator<std::unique_ptr<char[],std::default_delete<char[]>>>>
                    *)&this->_slicePointers,
                   (unique_ptr<char[],_std::default_delete<char[]>_> *)&_iex_throw_s);
        if (__iex_throw_s != (void *)0x0) {
          operator_delete__(__iex_throw_s);
        }
        this_01 = (this->_cachedBuffer)._M_t.
                  super___uniq_ptr_impl<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Imf_3_4::FrameBuffer_*,_std::default_delete<Imf_3_4::FrameBuffer>_>
                  .super__Head_base<0UL,_Imf_3_4::FrameBuffer_*,_false>._M_head_impl;
        pcVar10 = (this->_slicePointers).
                  super__Vector_base<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                  super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                  super__Head_base<0UL,_char_*,_false>._M_head_impl;
        iVar6 = TiledInputFile::levelWidth
                          ((this->_tFile)._M_t.
                           super___uniq_ptr_impl<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Imf_3_4::TiledInputFile_*,_std::default_delete<Imf_3_4::TiledInputFile>_>
                           .super__Head_base<0UL,_Imf_3_4::TiledInputFile_*,_false>._M_head_impl,0);
        Slice::Slice((Slice *)&_iex_throw_s,t,pcVar10 + -((long)iVar11 << sVar12),
                     (ulong)(t != _S_black) * 2 + 2,(long)iVar6 << sVar12,1,1,(double)fv,
                     (bool)in_R10B,true);
        FrameBuffer::insert(this_01,(char *)(cVar7._M_node + 1),(Slice *)&_iex_throw_s);
      }
      cVar7._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar7._M_node);
      CVar9 = FrameBuffer::end(frameBuffer);
    } while ((const_iterator)cVar7._M_node != CVar9._i._M_node);
  }
LAB_00186a76:
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
  ::operator=((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
               *)this_00,
              (_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
               *)frameBuffer);
  return;
}

Assistant:

void
InputFile::Data::lockedSetFrameBuffer (const FrameBuffer& frameBuffer)
{
    if (_storage == EXR_STORAGE_TILED)
    {
        //
        // We must invalidate the cached buffer if the new frame
        // buffer has a different set of channels than the old
        // frame buffer, or if the type of a channel has changed.
        //

        const FrameBuffer& oldFrameBuffer = _cacheFrameBuffer;

        FrameBuffer::ConstIterator i = oldFrameBuffer.begin ();
        FrameBuffer::ConstIterator j = frameBuffer.begin ();

        while (i != oldFrameBuffer.end () && j != frameBuffer.end ())
        {
            if (strcmp (i.name (), j.name ()) ||
                i.slice ().type != j.slice ().type)
                break;

            ++i;
            ++j;
        }

        if (i != oldFrameBuffer.end () || j != frameBuffer.end ())
        {
            //
            // Invalidate the cached buffer.
            //
            deleteCachedBuffer ();

            //
            // Create new a cached frame buffer.  It can hold a single
            // row of tiles.  The cached buffer can be reused for each
            // row of tiles because we set the yTileCoords parameter of
            // each Slice to true.
            //

            _cachedBuffer               = std::make_unique<FrameBuffer> ();
            int              partidx    = getPartIdx ();
            exr_attr_box2i_t dataWindow = _ctxt->dataWindow (partidx);
            _cachedOffset               = dataWindow.min.x;

            uint64_t tileRowSize =
                static_cast<uint64_t> (_tFile->tileYSize ()) *
                static_cast<uint64_t> (
                    static_cast<int64_t> (dataWindow.max.x) -
                    static_cast<int64_t> (dataWindow.min.x) +
                    1LL );

            // before we allocate a (potentially large) chunk of ram, let's
            // quick ensure we can read the tiles
            if (!_ctxt->chunkTableValid (getPartIdx ()))
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "Unable to use generic API to read with (partially?) corrupt chunk table in "
                    << _ctxt->fileName () << ", part " << getPartIdx () );
            }

            for (FrameBuffer::ConstIterator k = frameBuffer.begin ();
                 k != frameBuffer.end ();
                 ++k)
            {
                Slice s = k.slice ();

                //
                // omit adding channels that are not listed - 'fill' channels are added later
                //
                if (_ctxt->hasChannel (partidx, k.name ()))
                {
                    uint64_t bytes = (s.type == OPENEXR_IMF_INTERNAL_NAMESPACE::HALF) ? 2 : 4;
                    uint64_t offset = bytes * _cachedOffset;
                    uint64_t tilebytes = bytes * tileRowSize;

                    _slicePointers.emplace_back (std::make_unique<char[]> (tilebytes));

                    _cachedBuffer->insert (
                        k.name (),
                        Slice (
                            s.type,
                            _slicePointers.back ().get() - offset,
                            bytes,
                            bytes * _tFile->levelWidth (0),
                            1,
                            1,
                            s.fillValue,
                            false,
                            true));
                }
            }
        }

        _cacheFrameBuffer = frameBuffer;
    }
    else if (
        _storage == EXR_STORAGE_DEEP_SCANLINE ||
        _storage == EXR_STORAGE_DEEP_TILED)
    {
        if (!_compositor)
            _compositor = std::make_unique<CompositeDeepScanLine> ();
        _compositor->setFrameBuffer (frameBuffer);
    }
    else
    {
        _sFile->setFrameBuffer (frameBuffer);
        _cacheFrameBuffer = frameBuffer;
    }
}